

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udbgutil.cpp
# Opt level: O2

void udbg_writeIcuInfo(FILE *out)

{
  long lVar1;
  char *pcVar2;
  char *__format;
  long lVar3;
  UErrorCode status2;
  char str [2000];
  
  fwrite(" <icuSystemParams type=\"icu4c\">\n",0x20,1,(FILE *)out);
  for (lVar3 = 0; (lVar3 != 0x2a0 && (lVar1 = *(long *)((long)&systemParams + lVar3), lVar1 != 0));
      lVar3 = lVar3 + 0x20) {
    status2 = U_ZERO_ERROR;
    (**(code **)((long)&switchD_001ecf22::switchdataD_003c63b8 + lVar3))
              ((long)&systemParams + lVar3,str,2000,&status2);
    if (status2 < U_ILLEGAL_ARGUMENT_ERROR) {
      __format = "    <param name=\"%s\">%s</param>\n";
      pcVar2 = str;
    }
    else {
      pcVar2 = u_errorName_63(status2);
      __format = "  <!-- n=\"%s\" ERROR: %s -->\n";
    }
    fprintf((FILE *)out,__format,lVar1,pcVar2);
  }
  fwrite(" </icuSystemParams>\n",0x14,1,(FILE *)out);
  return;
}

Assistant:

U_CAPI void udbg_writeIcuInfo(FILE *out) {
  char str[2000];
  /* todo: API for writing DTD? */
  fprintf(out, " <icuSystemParams type=\"icu4c\">\n");
  const char *paramName;
  for(int32_t i=0;(paramName=udbg_getSystemParameterNameByIndex(i))!=NULL;i++) {
    UErrorCode status2 = U_ZERO_ERROR;
    udbg_getSystemParameterValueByIndex(i, str,2000,&status2);
    if(U_SUCCESS(status2)) {
      fprintf(out,"    <param name=\"%s\">%s</param>\n", paramName,str);
    } else {
      fprintf(out,"  <!-- n=\"%s\" ERROR: %s -->\n", paramName, u_errorName(status2));
    }
  }
  fprintf(out, " </icuSystemParams>\n");
}